

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.h
# Opt level: O2

void __thiscall
MeCab::scoped_ptr<MeCab::DictionaryRewriter>::reset
          (scoped_ptr<MeCab::DictionaryRewriter> *this,DictionaryRewriter *p)

{
  DictionaryRewriter *this_00;
  
  this_00 = this->ptr_;
  if (this_00 != (DictionaryRewriter *)0x0) {
    DictionaryRewriter::~DictionaryRewriter(this_00);
  }
  operator_delete(this_00);
  this->ptr_ = p;
  return;
}

Assistant:

void reset(T * p = 0) {
    delete ptr_;
    ptr_ = p;
  }